

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm_encode_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  pointer pcVar2;
  SentencePieceText *pSVar3;
  NBestSentencePieceText *pNVar4;
  long *plVar5;
  char cVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  value_type *__x;
  uint *puVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  undefined4 *puVar13;
  double *pdVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long *plVar17;
  undefined8 uVar18;
  _func_void__Any_data_ptr_basic_string_view<char,_std::char_traits<char>_>_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  void *__dest;
  pointer pbVar19;
  uint uVar20;
  ulong uVar21;
  pointer ppVar22;
  undefined1 auVar23 [16];
  ScopedResourceDestructor cleaner;
  int nbest_size;
  float alpha;
  unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
  output;
  unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
  input;
  Status _status_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest_args;
  flat_hash_map<std::string,_int> vocab;
  SentencePieceText spt;
  SentencePieceProcessor sp;
  vector<int,_std::allocator<int>_> ids;
  NBestSentencePieceText nbest_spt;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sps;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  nbest_ids;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  nbest_sps;
  _Any_data __tmp;
  _Any_data __tmp_11;
  _Any_data __tmp_8;
  _Any_data __tmp_3;
  undefined1 local_2f8 [24];
  SentencePieceText *pSStack_2e0;
  SentencePieceText *local_2d8;
  ScopedResourceDestructor local_2cd;
  undefined4 local_2cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  SentencePieceText *pSStack_2c0;
  NBestSentencePieceText *local_2b8;
  SentencePieceText *pSStack_2b0;
  float local_2a4;
  long *local_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_240;
  long *local_208;
  long local_200;
  long local_1f8 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [2];
  void *local_158;
  undefined8 uStack_150;
  long local_148;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_140;
  Die local_128 [48];
  SentencePieceText *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  SentencePieceText local_e8;
  undefined7 uStack_e7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  pointer local_c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98 [4];
  
  absl::ParseCommandLine((int)local_1b0,(char **)(ulong)(uint)argc);
  __dest = (void *)((long)argv +
                   ((long)argc * 8 -
                   (local_1b0[0]._M_string_length - (long)local_1b0[0]._M_dataplus._M_p)));
  uVar21 = local_1b0[0]._M_string_length - (long)local_1b0[0]._M_dataplus._M_p;
  if (uVar21 != 0) {
    memmove(__dest,local_1b0[0]._M_dataplus._M_p,uVar21);
  }
  piVar8 = (int *)absl::Flag<int>::value();
  sentencepiece::logging::SetMinLogLevel(*piVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,
                    local_1b0[0].field_2._M_allocated_capacity - (long)local_1b0[0]._M_dataplus._M_p
                   );
  }
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) == 0) {
    uVar20 = (uint)(uVar21 >> 3);
    if (1 < (int)uVar20) {
      uVar21 = 1;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,*(char **)((long)__dest + uVar21 * 8),
                   (allocator<char> *)&local_208);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
                   local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
          operator_delete(local_1b0[0]._M_dataplus._M_p,
                          local_1b0[0].field_2._M_allocated_capacity + 1);
        }
        uVar21 = uVar21 + 1;
      } while ((uVar20 & 0x7fffffff) != uVar21);
    }
  }
  else {
    __x = (value_type *)absl::Flag<std::__cxx11::string>::value();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_258,__x);
  }
  piVar8 = (int *)absl::Flag<unsigned_int>::value();
  if (*piVar8 != -1) {
    puVar10 = (uint *)absl::Flag<unsigned_int>::value();
    sentencepiece::SetRandomGeneratorSeed(*puVar10);
  }
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258,
               local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
    }
  }
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) == 0) {
    local_1b0[0]._M_dataplus._M_p._0_1_ = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"!absl::GetFlag(FLAGS_model).empty()",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
    sentencepiece::error::Die::~Die((Die *)local_1b0);
  }
  sentencepiece::SentencePieceProcessor::SentencePieceProcessor((SentencePieceProcessor *)local_1b0)
  ;
  puVar12 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::SentencePieceProcessor::Load(&local_240,local_1b0,puVar12[1],*puVar12);
  if (local_240._M_buckets != (__buckets_ptr)0x0) {
    local_128[0].die_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_status.ok()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_208,local_200);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    sentencepiece::error::Die::~Die(local_128);
  }
  sentencepiece::util::Status::~Status((Status *)&local_240);
  puVar12 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::SentencePieceProcessor::SetEncodeExtraOptions
            (&local_240,local_1b0,puVar12[1],*puVar12);
  if (local_240._M_buckets != (__buckets_ptr)0x0) {
    local_128[0].die_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_status.ok()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_208,local_200);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    sentencepiece::error::Die::~Die(local_128);
  }
  sentencepiece::util::Status::~Status((Status *)&local_240);
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) != 0) {
    puVar12 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
    uVar18 = *puVar12;
    uVar1 = puVar12[1];
    puVar13 = (undefined4 *)absl::Flag<int>::value();
    sentencepiece::SentencePieceProcessor::LoadVocabulary
              (&local_240,local_1b0,uVar1,uVar18,*puVar13);
    if (local_240._M_buckets != (__buckets_ptr)0x0) {
      local_128[0].die_ = true;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x52);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_status.ok()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
      sentencepiece::util::Status::ToString_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_208,local_200);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      sentencepiece::error::Die::~Die(local_128);
    }
    sentencepiece::util::Status::~Status((Status *)&local_240);
  }
  puVar12 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::filesystem::NewWritableFile((SentencePieceText *)&local_2a0,puVar12[1],*puVar12,0);
  (**(code **)(*local_2a0 + 0x10))(&local_240);
  if (local_240._M_buckets != (__buckets_ptr)0x0) {
    local_128[0].die_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_status.ok()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_208,local_200);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    sentencepiece::error::Die::~Die(local_128);
  }
  sentencepiece::util::Status::~Status((Status *)&local_240);
  local_f8 = &local_e8;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8 = (SentencePieceText)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = 0;
  local_158 = (void *)0x0;
  uStack_150 = 0;
  local_98[0].
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98[0].
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98[0].
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  sentencepiece::SentencePieceText::SentencePieceText((SentencePieceText *)&local_208,(Arena *)0x0);
  sentencepiece::NBestSentencePieceText::NBestSentencePieceText
            ((NBestSentencePieceText *)local_128,(Arena *)0x0);
  local_2b8 = (NBestSentencePieceText *)0x0;
  pSStack_2b0 = (SentencePieceText *)0x0;
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSStack_2c0 = (SentencePieceText *)0x0;
  puVar13 = (undefined4 *)absl::Flag<int>::value();
  local_2cc = *puVar13;
  pdVar14 = (double *)absl::Flag<double>::value();
  local_2a4 = (float)*pdVar14;
  pcVar15 = (char *)absl::Flag<bool>::value();
  if (*pcVar15 == '\x01') {
    local_2f8._16_8_ = (NBestSentencePieceText *)0x0;
    pSStack_2e0 = (SentencePieceText *)0x0;
    local_2f8._0_8_ = (SentencePieceProcessor *)0x0;
    local_2f8._8_8_ = (SentencePieceText *)0x0;
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new(0x18);
    pNVar4 = local_2b8;
    (pbVar16->_M_dataplus)._M_p = (pointer)local_1b0;
    pbVar16->_M_string_length = (size_type)&local_208;
    (pbVar16->field_2)._M_allocated_capacity = (size_type)&local_240;
    local_2f8._0_8_ = local_2c8;
    pSVar3 = pSStack_2c0;
    pSStack_2c0 = (SentencePieceText *)local_2f8._8_8_;
    local_2f8._16_8_ = local_2b8;
    local_2b8 = (NBestSentencePieceText *)
                std::
                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:103:15)>
                ::_M_manager;
    pSStack_2e0 = pSStack_2b0;
    pSStack_2b0 = (SentencePieceText *)
                  std::
                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:103:15)>
                  ::_M_invoke;
    local_2f8._8_8_ = pSVar3;
    local_2c8 = pbVar16;
    if (pNVar4 != (NBestSentencePieceText *)0x0) {
      (*(code *)pNVar4)(local_2f8,local_2f8,3);
    }
  }
  else {
    pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
    iVar7 = std::__cxx11::string::compare(pcVar15);
    if (iVar7 == 0) {
      local_2f8._16_8_ = (NBestSentencePieceText *)0x0;
      pSStack_2e0 = (SentencePieceText *)0x0;
      local_2f8._0_8_ = (SentencePieceProcessor *)0x0;
      local_2f8._8_8_ = (SentencePieceText *)0x0;
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x18);
      pNVar4 = local_2b8;
      uVar18 = local_2f8._8_8_;
      (pbVar16->_M_dataplus)._M_p = (pointer)local_1b0;
      pbVar16->_M_string_length = (size_type)&local_d8;
      (pbVar16->field_2)._M_allocated_capacity = (size_type)&local_2a0;
      local_2f8._0_8_ = local_2c8;
      local_2f8._8_8_ = pSStack_2c0;
      pSStack_2c0 = (SentencePieceText *)uVar18;
      local_2f8._16_8_ = local_2b8;
      local_2b8 = (NBestSentencePieceText *)
                  std::
                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:111:15)>
                  ::_M_manager;
      pSStack_2e0 = pSStack_2b0;
      pSStack_2b0 = (SentencePieceText *)
                    std::
                    _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:111:15)>
                    ::_M_invoke;
      local_2c8 = pbVar16;
      if (pNVar4 != (NBestSentencePieceText *)0x0) {
        (*(code *)pNVar4)(local_2f8,local_2f8,3);
      }
    }
    else {
      pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
      iVar7 = std::__cxx11::string::compare(pcVar15);
      if (iVar7 == 0) {
        local_2f8._16_8_ = (NBestSentencePieceText *)0x0;
        pSStack_2e0 = (SentencePieceText *)0x0;
        local_2f8._0_8_ = (SentencePieceProcessor *)0x0;
        local_2f8._8_8_ = (SentencePieceText *)0x0;
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  operator_new(0x18);
        pNVar4 = local_2b8;
        uVar18 = local_2f8._8_8_;
        (pbVar16->_M_dataplus)._M_p = (pointer)local_1b0;
        pbVar16->_M_string_length = (size_type)&local_158;
        (pbVar16->field_2)._M_allocated_capacity = (size_type)&local_2a0;
        local_2f8._0_8_ = local_2c8;
        local_2f8._8_8_ = pSStack_2c0;
        pSStack_2c0 = (SentencePieceText *)uVar18;
        local_2f8._16_8_ = local_2b8;
        local_2b8 = (NBestSentencePieceText *)
                    std::
                    _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:116:15)>
                    ::_M_manager;
        pSStack_2e0 = pSStack_2b0;
        pSStack_2b0 = (SentencePieceText *)
                      std::
                      _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:116:15)>
                      ::_M_invoke;
        local_2c8 = pbVar16;
        if (pNVar4 != (NBestSentencePieceText *)0x0) {
          (*(code *)pNVar4)(local_2f8,local_2f8,3);
        }
      }
      else {
        pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
        iVar7 = std::__cxx11::string::compare(pcVar15);
        pNVar4 = local_2b8;
        if (iVar7 == 0) {
          local_2f8._0_8_ = local_2c8;
          local_2f8._8_8_ = pSStack_2c0;
          local_2f8._16_8_ = local_2b8;
          local_2b8 = (NBestSentencePieceText *)
                      std::
                      _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:121:15)>
                      ::_M_manager;
          pSStack_2e0 = pSStack_2b0;
          pSStack_2b0 = (SentencePieceText *)
                        std::
                        _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:121:15)>
                        ::_M_invoke;
          local_2c8 = local_1b0;
          pSStack_2c0 = (SentencePieceText *)&local_208;
          if (pNVar4 != (NBestSentencePieceText *)0x0) {
            (*(code *)pNVar4)(local_2f8,local_2f8,3);
          }
        }
        else {
          pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
          iVar7 = std::__cxx11::string::compare(pcVar15);
          if (iVar7 == 0) {
            local_2f8._16_8_ = (NBestSentencePieceText *)0x0;
            pSStack_2e0 = (SentencePieceText *)0x0;
            local_2f8._0_8_ = (SentencePieceProcessor *)0x0;
            local_2f8._8_8_ = (SentencePieceText *)0x0;
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      operator_new(0x28);
            pNVar4 = local_2b8;
            uVar18 = local_2f8._8_8_;
            (pbVar16->_M_dataplus)._M_p = (pointer)local_1b0;
            pbVar16->_M_string_length = (size_type)&local_2cc;
            (pbVar16->field_2)._M_allocated_capacity = (size_type)&local_2a4;
            *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)((long)&pbVar16->field_2 + 8) = &local_d8;
            pbVar16[1]._M_dataplus._M_p = (pointer)&local_2a0;
            local_2f8._0_8_ = local_2c8;
            local_2f8._8_8_ = pSStack_2c0;
            pSStack_2c0 = (SentencePieceText *)uVar18;
            local_2f8._16_8_ = local_2b8;
            local_2b8 = (NBestSentencePieceText *)
                        std::
                        _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:123:15)>
                        ::_M_manager;
            pSStack_2e0 = pSStack_2b0;
            pSStack_2b0 = (SentencePieceText *)
                          std::
                          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:123:15)>
                          ::_M_invoke;
            local_2c8 = pbVar16;
            if (pNVar4 != (NBestSentencePieceText *)0x0) {
              (*(code *)pNVar4)(local_2f8,local_2f8,3);
            }
          }
          else {
            pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
            iVar7 = std::__cxx11::string::compare(pcVar15);
            if (iVar7 == 0) {
              local_2f8._8_8_ = &local_2cc;
              local_2f8._16_8_ = &local_2a4;
              pSStack_2e0 = (SentencePieceText *)&local_158;
              local_2f8._0_8_ = local_1b0;
              local_2d8 = (SentencePieceText *)&local_2a0;
              std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                        ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                         &local_2c8,(anon_class_40_5_eb105556 *)local_2f8);
            }
            else {
              pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
              iVar7 = std::__cxx11::string::compare(pcVar15);
              if (iVar7 == 0) {
                local_2f8._8_8_ = &local_2cc;
                local_2f8._16_8_ = &local_2a4;
                local_2f8._0_8_ = local_1b0;
                pSStack_2e0 = (SentencePieceText *)&local_208;
                std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                          ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                           &local_2c8,(anon_class_32_4_3cd1434b *)local_2f8);
              }
              else {
                pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
                iVar7 = std::__cxx11::string::compare(pcVar15);
                if (iVar7 == 0) {
                  local_2f8._8_8_ = &local_2cc;
                  local_2f8._16_8_ = local_98;
                  local_2f8._0_8_ = local_1b0;
                  pSStack_2e0 = (SentencePieceText *)&local_2a0;
                  std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                  operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                            &local_2c8,(anon_class_32_4_a85ed13a *)local_2f8);
                }
                else {
                  pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
                  iVar7 = std::__cxx11::string::compare(pcVar15);
                  if (iVar7 == 0) {
                    local_2f8._8_8_ = &local_2cc;
                    local_2f8._16_8_ = &local_b8;
                    local_2f8._0_8_ = local_1b0;
                    pSStack_2e0 = (SentencePieceText *)&local_2a0;
                    std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                    operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)> *
                              )&local_2c8,(anon_class_32_4_a85a1878 *)local_2f8);
                  }
                  else {
                    pcVar15 = (char *)absl::Flag<std::__cxx11::string>::value();
                    iVar7 = std::__cxx11::string::compare(pcVar15);
                    if (iVar7 == 0) {
                      local_2f8._8_8_ = &local_2cc;
                      local_2f8._0_8_ = local_1b0;
                      local_2f8._16_8_ = (NBestSentencePieceText *)local_128;
                      std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                      operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)>
                                 *)&local_2c8,(anon_class_24_3_9840e6c0 *)local_2f8);
                    }
                    else {
                      iVar7 = sentencepiece::logging::GetMinLogLevel();
                      if (iVar7 < 4) {
                        local_2f8[0] = 1;
                        poVar11 = std::operator<<((ostream *)&std::cerr,"spm_encode_main.cc");
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
                        poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x9b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") ",2);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"LOG(",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"FATAL",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") ",2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,"Unknown output format: ",0x17);
                        puVar12 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)*puVar12,puVar12[1]);
                        sentencepiece::error::Die::~Die((Die *)local_2f8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_c0 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar19 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      sentencepiece::filesystem::NewReadableFile
                (&local_298,pbVar19->_M_string_length,(pbVar19->_M_dataplus)._M_p,0);
      (**(code **)(*local_298 + 0x10))(&local_278);
      if (local_278._M_dataplus._M_p != (pointer)0x0) {
        local_140.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"spm_encode_main.cc",0x12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_status.ok()",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
        sentencepiece::util::Status::ToString_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(char *)local_2f8._0_8_,local_2f8._8_8_);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10))
        {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        sentencepiece::error::Die::~Die((Die *)&local_140);
      }
      sentencepiece::util::Status::~Status((Status *)&local_278);
      while( true ) {
        cVar6 = (**(code **)(*local_298 + 0x18))(local_298,&local_f8);
        if (cVar6 == '\0') break;
        local_2f8._0_8_ = local_f0;
        local_2f8._8_8_ = local_f8;
        if (local_2b8 == (NBestSentencePieceText *)0x0) {
          uVar18 = std::__throw_bad_function_call();
          if (local_2b8 != (NBestSentencePieceText *)0x0) {
            (*(code *)local_2b8)(&local_2c8,&local_2c8,3);
          }
          sentencepiece::NBestSentencePieceText::~NBestSentencePieceText
                    ((NBestSentencePieceText *)local_128);
          sentencepiece::SentencePieceText::~SentencePieceText((SentencePieceText *)&local_208);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_240);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_b8);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(local_98);
          if (local_158 != (void *)0x0) {
            operator_delete(local_158,local_148 - (long)local_158);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_d8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
          }
          if (local_2a0 != (long *)0x0) {
            (**(code **)(*local_2a0 + 8))();
          }
          local_2a0 = (long *)0x0;
          sentencepiece::SentencePieceProcessor::~SentencePieceProcessor
                    ((SentencePieceProcessor *)local_1b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_258);
          sentencepiece::ScopedResourceDestructor::~ScopedResourceDestructor(&local_2cd);
          _Unwind_Resume(uVar18);
        }
        (*(code *)pSStack_2b0)(&local_2c8,local_2f8);
      }
      if (local_298 != (ulong *)0x0) {
        (**(code **)(*local_298 + 8))();
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != local_c0);
  }
  auVar23 = absl::Flag<bool>::value();
  if (*auVar23._0_8_ == '\x01') {
    sentencepiece::Sorted<std::__cxx11::string,int>
              (&local_140,(sentencepiece *)&local_240,auVar23._8_8_);
    ppVar22 = (pointer)CONCAT71(local_140.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_140.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (ppVar22 !=
        local_140.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        plVar5 = local_2a0;
        pcVar2 = (ppVar22->first)._M_dataplus._M_p;
        local_298 = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar2,pcVar2 + (ppVar22->first)._M_string_length);
        std::__cxx11::string::append((char *)&local_298);
        sentencepiece::string_util::SimpleItoa<int>(&local_278,ppVar22->second);
        uVar21 = 0xf;
        if (local_298 != local_288) {
          uVar21 = local_288[0];
        }
        if (uVar21 < local_278._M_string_length + local_290) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            uVar18 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_278._M_string_length + local_290) goto LAB_00105b44;
          plVar17 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_278,0,(char *)0x0,(ulong)local_298);
        }
        else {
LAB_00105b44:
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_298,(ulong)local_278._M_dataplus._M_p);
        }
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar17 + 2)
        ;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar17 == pbVar16
           ) {
          local_2f8._16_8_ = (pbVar16->_M_dataplus)._M_p;
          pSStack_2e0 = (SentencePieceText *)plVar17[3];
          local_2f8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_2f8 + 0x10);
        }
        else {
          local_2f8._16_8_ = (pbVar16->_M_dataplus)._M_p;
          local_2f8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar17;
        }
        local_2f8._8_8_ = plVar17[1];
        *plVar17 = (long)pbVar16;
        plVar17[1] = 0;
        *(undefined1 *)&(pbVar16->_M_dataplus)._M_p = 0;
        (**(code **)(*plVar5 + 0x20))(plVar5,local_2f8._8_8_,local_2f8._0_8_);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10))
        {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_298 != local_288) {
          operator_delete(local_298,local_288[0] + 1);
        }
        ppVar22 = ppVar22 + 1;
      } while (ppVar22 !=
               local_140.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector(&local_140);
  }
  if (local_2b8 != (NBestSentencePieceText *)0x0) {
    (*(code *)local_2b8)(&local_2c8,&local_2c8,3);
  }
  sentencepiece::NBestSentencePieceText::~NBestSentencePieceText
            ((NBestSentencePieceText *)local_128);
  sentencepiece::SentencePieceText::~SentencePieceText((SentencePieceText *)&local_208);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_240);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(local_98);
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,local_148 - (long)local_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  if (local_2a0 != (long *)0x0) {
    (**(code **)(*local_2a0 + 8))();
  }
  sentencepiece::SentencePieceProcessor::~SentencePieceProcessor
            ((SentencePieceProcessor *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  sentencepiece::ScopedResourceDestructor::~ScopedResourceDestructor(&local_2cd);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  sentencepiece::ScopedResourceDestructor cleaner;
  sentencepiece::ParseCommandLineFlags(argv[0], &argc, &argv, true);
  std::vector<std::string> rest_args;

  if (absl::GetFlag(FLAGS_input).empty()) {
    for (int i = 1; i < argc; ++i) {
      rest_args.push_back(std::string(argv[i]));
    }
  } else {
    rest_args.push_back(absl::GetFlag(FLAGS_input));
  }

  if (absl::GetFlag(FLAGS_random_seed) != -1) {
    sentencepiece::SetRandomGeneratorSeed(absl::GetFlag(FLAGS_random_seed));
  }

  if (rest_args.empty())
    rest_args.push_back("");  // empty means that reading from stdin.

  CHECK(!absl::GetFlag(FLAGS_model).empty());

  sentencepiece::SentencePieceProcessor sp;
  CHECK_OK(sp.Load(absl::GetFlag(FLAGS_model)));
  CHECK_OK(sp.SetEncodeExtraOptions(absl::GetFlag(FLAGS_extra_options)));

  if (!absl::GetFlag(FLAGS_vocabulary).empty()) {
    CHECK_OK(sp.LoadVocabulary(absl::GetFlag(FLAGS_vocabulary),
                               absl::GetFlag(FLAGS_vocabulary_threshold)));
  }

  auto output =
      sentencepiece::filesystem::NewWritableFile(absl::GetFlag(FLAGS_output));
  CHECK_OK(output->status());

  std::string line;
  std::vector<std::string> sps;
  std::vector<int> ids;
  std::vector<std::vector<std::string>> nbest_sps;
  std::vector<std::vector<int>> nbest_ids;
  absl::flat_hash_map<std::string, int> vocab;
  sentencepiece::SentencePieceText spt;
  sentencepiece::NBestSentencePieceText nbest_spt;
  std::function<void(absl::string_view line)> process;

  const int nbest_size = absl::GetFlag(FLAGS_nbest_size);
  const float alpha = absl::GetFlag(FLAGS_alpha);

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &spt));
      for (const auto &piece : spt.pieces()) {
        if (!sp.IsUnknown(piece.id()) && !sp.IsControl(piece.id()))
          vocab[piece.piece()]++;
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "proto") {
    process = [&](absl::string_view line) { CHECK_OK(sp.Encode(line, &spt)); };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &spt));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_sps));
      for (const auto &result : nbest_sps) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_ids));
      for (const auto &result : nbest_ids) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_spt));
    };
  } else {
    LOG(FATAL) << "Unknown output format: "
               << absl::GetFlag(FLAGS_output_format);
  }

  for (const auto &filename : rest_args) {
    auto input = sentencepiece::filesystem::NewReadableFile(filename);
    CHECK_OK(input->status());
    while (input->ReadLine(&line)) {
      process(line);
    }
  }

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    for (const auto &it : sentencepiece::Sorted(vocab)) {
      output->WriteLine(it.first + "\t" +
                        sentencepiece::string_util::SimpleItoa(it.second));
    }
  }

  return 0;
}